

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O1

optional<std::vector<bool,_std::allocator<bool>_>_> * __thiscall
tinyusdz::primvar::PrimVar::get_default_value<std::vector<bool,std::allocator<bool>>>
          (optional<std::vector<bool,_std::allocator<bool>_>_> *__return_storage_ptr__,PrimVar *this
          )

{
  optional<std::vector<bool,_std::allocator<bool>_>_> local_40;
  
  get_value<std::vector<bool,std::allocator<bool>>>(&local_40,this);
  __return_storage_ptr__->has_value_ = local_40.has_value_;
  if (local_40.has_value_ == true) {
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x20) = local_40.contained._32_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x10) = local_40.contained._16_8_;
    *(ulong *)((long)&__return_storage_ptr__->contained + 0x18) =
         CONCAT44(local_40.contained._28_4_,local_40.contained._24_4_);
    *(anon_struct_8_0_00000001_for___align *)&__return_storage_ptr__->contained =
         local_40.contained.data.__align;
    *(ulong *)((long)&__return_storage_ptr__->contained + 8) =
         CONCAT44(local_40.contained._12_4_,local_40.contained._8_4_);
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<T> get_default_value() const {
    return get_value<T>();
  }